

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::PickNegLogSoftmax::backward_impl
          (PickNegLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer ppTVar9;
  Tensor *pTVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  pointer puVar12;
  pointer puVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined1 auVar21 [16];
  byte bVar22;
  byte bVar23;
  PointerType pfVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  runtime_error *this_00;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ushort uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  int iVar44;
  int iVar45;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f8;
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  ppTVar9 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar10 = *ppTVar9;
  uVar3 = (pTVar10->d).nd;
  uVar29 = (ulong)uVar3;
  if ((1 < uVar29) && ((pTVar10->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"PickNegLogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->pval == (uint *)0x0) {
    pvVar11 = this->pvals;
    if (pvVar11 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b8,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    puVar12 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar13 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar30 = (long)puVar13 - (long)puVar12 >> 2;
    if (uVar30 != (fx->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b9,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    if (puVar13 != puVar12) {
      pfVar14 = dEdf->v;
      pfVar15 = pTVar10->v;
      uVar4 = (pTVar10->d).d[0];
      uVar5 = (pTVar10->d).bd;
      pfVar16 = dEdxi->v;
      uVar6 = (dEdxi->d).bd;
      uVar7 = (dEdxi->d).d[0];
      uVar8 = (dEdxi->d).nd;
      pfVar17 = this->logz;
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vpbroadcastq_avx512f();
      uVar32 = 0;
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_98 = vmovdqu64_avx512f(auVar37);
      local_d8 = vmovdqu64_avx512f(auVar38);
      do {
        iVar45 = 1;
        iVar44 = 1;
        if (uVar29 != 0) {
          uVar26 = 0;
          auVar41 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar42 = vmovdqa64_avx512f(auVar41);
            auVar41 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar41,auVar39);
            auVar41 = vporq_avx512f(auVar41,auVar40);
            uVar20 = vpcmpuq_avx512f(auVar41,auVar37,2);
            bVar22 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar43,auVar37,2);
            bVar23 = (byte)uVar20;
            uVar35 = CONCAT11(bVar23,bVar22);
            auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar10->d).d + uVar26));
            auVar43._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar41._4_4_;
            auVar43._0_4_ = (uint)(bVar22 & 1) * auVar41._0_4_;
            auVar43._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar41._8_4_;
            auVar43._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar41._12_4_;
            auVar43._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * auVar41._16_4_;
            auVar43._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * auVar41._20_4_;
            auVar43._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * auVar41._24_4_;
            auVar43._28_4_ = (uint)((byte)(uVar35 >> 7) & 1) * auVar41._28_4_;
            auVar43._32_4_ = (uint)(bVar23 & 1) * auVar41._32_4_;
            auVar43._36_4_ = (uint)(bVar23 >> 1 & 1) * auVar41._36_4_;
            auVar43._40_4_ = (uint)(bVar23 >> 2 & 1) * auVar41._40_4_;
            auVar43._44_4_ = (uint)(bVar23 >> 3 & 1) * auVar41._44_4_;
            auVar43._48_4_ = (uint)(bVar23 >> 4 & 1) * auVar41._48_4_;
            auVar43._52_4_ = (uint)(bVar23 >> 5 & 1) * auVar41._52_4_;
            auVar43._56_4_ = (uint)(bVar23 >> 6 & 1) * auVar41._56_4_;
            auVar43._60_4_ = (uint)(bVar23 >> 7) * auVar41._60_4_;
            auVar41 = vpmulld_avx512f(auVar43,auVar42);
            uVar26 = uVar26 + 0x10;
          } while ((uVar29 + 0xf & 0xfffffffffffffff0) != uVar26);
          auVar41 = vmovdqa32_avx512f(auVar41);
          auVar37._0_4_ =
               (uint)(bVar22 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar22 & 1) * auVar42._0_4_;
          bVar18 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar18 * auVar41._4_4_ | (uint)!bVar18 * auVar42._4_4_;
          bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar18 * auVar41._8_4_ | (uint)!bVar18 * auVar42._8_4_;
          bVar18 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar18 * auVar41._12_4_ | (uint)!bVar18 * auVar42._12_4_;
          bVar18 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar37._16_4_ = (uint)bVar18 * auVar41._16_4_ | (uint)!bVar18 * auVar42._16_4_;
          bVar18 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar37._20_4_ = (uint)bVar18 * auVar41._20_4_ | (uint)!bVar18 * auVar42._20_4_;
          bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar37._24_4_ = (uint)bVar18 * auVar41._24_4_ | (uint)!bVar18 * auVar42._24_4_;
          bVar18 = (bool)((byte)(uVar35 >> 7) & 1);
          auVar37._28_4_ = (uint)bVar18 * auVar41._28_4_ | (uint)!bVar18 * auVar42._28_4_;
          auVar37._32_4_ =
               (uint)(bVar23 & 1) * auVar41._32_4_ | (uint)!(bool)(bVar23 & 1) * auVar42._32_4_;
          bVar18 = (bool)(bVar23 >> 1 & 1);
          auVar37._36_4_ = (uint)bVar18 * auVar41._36_4_ | (uint)!bVar18 * auVar42._36_4_;
          bVar18 = (bool)(bVar23 >> 2 & 1);
          auVar37._40_4_ = (uint)bVar18 * auVar41._40_4_ | (uint)!bVar18 * auVar42._40_4_;
          bVar18 = (bool)(bVar23 >> 3 & 1);
          auVar37._44_4_ = (uint)bVar18 * auVar41._44_4_ | (uint)!bVar18 * auVar42._44_4_;
          bVar18 = (bool)(bVar23 >> 4 & 1);
          auVar37._48_4_ = (uint)bVar18 * auVar41._48_4_ | (uint)!bVar18 * auVar42._48_4_;
          bVar18 = (bool)(bVar23 >> 5 & 1);
          auVar37._52_4_ = (uint)bVar18 * auVar41._52_4_ | (uint)!bVar18 * auVar42._52_4_;
          bVar18 = (bool)(bVar23 >> 6 & 1);
          auVar37._56_4_ = (uint)bVar18 * auVar41._56_4_ | (uint)!bVar18 * auVar42._56_4_;
          auVar37._60_4_ =
               (uint)(bVar23 >> 7) * auVar41._60_4_ | (uint)!(bool)(bVar23 >> 7) * auVar42._60_4_;
          auVar36 = vextracti64x4_avx512f(auVar37,1);
          auVar37 = vpmulld_avx512f(auVar37,ZEXT3264(auVar36));
          auVar21 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
          auVar19 = vpshufd_avx(auVar21,0xee);
          auVar21 = vpmulld_avx(auVar21,auVar19);
          auVar19 = vpshufd_avx(auVar21,0x55);
          auVar21 = vpmulld_avx(auVar21,auVar19);
          iVar44 = auVar21._0_4_;
        }
        uVar28 = 1;
        if (1 < uVar3) {
          uVar28 = (pTVar10->d).d[1];
        }
        uVar26 = (ulong)puVar12[uVar32];
        fVar1 = pfVar14[uVar32];
        if (uVar8 != 0) {
          uVar27 = 0;
          auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar41 = vmovdqa64_avx512f(auVar37);
            auVar37 = vpbroadcastq_avx512f();
            auVar42 = vporq_avx512f(auVar37,auVar39);
            auVar37 = vporq_avx512f(auVar37,auVar40);
            uVar20 = vpcmpuq_avx512f(auVar37,auVar38,2);
            bVar22 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar42,auVar38,2);
            bVar23 = (byte)uVar20;
            uVar35 = CONCAT11(bVar23,bVar22);
            auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar27));
            auVar42._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar37._4_4_;
            auVar42._0_4_ = (uint)(bVar22 & 1) * auVar37._0_4_;
            auVar42._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar37._8_4_;
            auVar42._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar37._12_4_;
            auVar42._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * auVar37._16_4_;
            auVar42._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * auVar37._20_4_;
            auVar42._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * auVar37._24_4_;
            auVar42._28_4_ = (uint)((byte)(uVar35 >> 7) & 1) * auVar37._28_4_;
            auVar42._32_4_ = (uint)(bVar23 & 1) * auVar37._32_4_;
            auVar42._36_4_ = (uint)(bVar23 >> 1 & 1) * auVar37._36_4_;
            auVar42._40_4_ = (uint)(bVar23 >> 2 & 1) * auVar37._40_4_;
            auVar42._44_4_ = (uint)(bVar23 >> 3 & 1) * auVar37._44_4_;
            auVar42._48_4_ = (uint)(bVar23 >> 4 & 1) * auVar37._48_4_;
            auVar42._52_4_ = (uint)(bVar23 >> 5 & 1) * auVar37._52_4_;
            auVar42._56_4_ = (uint)(bVar23 >> 6 & 1) * auVar37._56_4_;
            auVar42._60_4_ = (uint)(bVar23 >> 7) * auVar37._60_4_;
            auVar37 = vpmulld_avx512f(auVar42,auVar41);
            uVar27 = uVar27 + 0x10;
          } while (((ulong)uVar8 + 0xf & 0xfffffffffffffff0) != uVar27);
          auVar37 = vmovdqa32_avx512f(auVar37);
          auVar38._0_4_ =
               (uint)(bVar22 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar22 & 1) * auVar41._0_4_;
          bVar18 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar38._4_4_ = (uint)bVar18 * auVar37._4_4_ | (uint)!bVar18 * auVar41._4_4_;
          bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar38._8_4_ = (uint)bVar18 * auVar37._8_4_ | (uint)!bVar18 * auVar41._8_4_;
          bVar18 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar38._12_4_ = (uint)bVar18 * auVar37._12_4_ | (uint)!bVar18 * auVar41._12_4_;
          bVar18 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar38._16_4_ = (uint)bVar18 * auVar37._16_4_ | (uint)!bVar18 * auVar41._16_4_;
          bVar18 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar38._20_4_ = (uint)bVar18 * auVar37._20_4_ | (uint)!bVar18 * auVar41._20_4_;
          bVar18 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar38._24_4_ = (uint)bVar18 * auVar37._24_4_ | (uint)!bVar18 * auVar41._24_4_;
          bVar18 = (bool)((byte)(uVar35 >> 7) & 1);
          auVar38._28_4_ = (uint)bVar18 * auVar37._28_4_ | (uint)!bVar18 * auVar41._28_4_;
          auVar38._32_4_ =
               (uint)(bVar23 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar23 & 1) * auVar41._32_4_;
          bVar18 = (bool)(bVar23 >> 1 & 1);
          auVar38._36_4_ = (uint)bVar18 * auVar37._36_4_ | (uint)!bVar18 * auVar41._36_4_;
          bVar18 = (bool)(bVar23 >> 2 & 1);
          auVar38._40_4_ = (uint)bVar18 * auVar37._40_4_ | (uint)!bVar18 * auVar41._40_4_;
          bVar18 = (bool)(bVar23 >> 3 & 1);
          auVar38._44_4_ = (uint)bVar18 * auVar37._44_4_ | (uint)!bVar18 * auVar41._44_4_;
          bVar18 = (bool)(bVar23 >> 4 & 1);
          auVar38._48_4_ = (uint)bVar18 * auVar37._48_4_ | (uint)!bVar18 * auVar41._48_4_;
          bVar18 = (bool)(bVar23 >> 5 & 1);
          auVar38._52_4_ = (uint)bVar18 * auVar37._52_4_ | (uint)!bVar18 * auVar41._52_4_;
          bVar18 = (bool)(bVar23 >> 6 & 1);
          auVar38._56_4_ = (uint)bVar18 * auVar37._56_4_ | (uint)!bVar18 * auVar41._56_4_;
          auVar38._60_4_ =
               (uint)(bVar23 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar23 >> 7) * auVar41._60_4_;
          auVar36 = vextracti64x4_avx512f(auVar38,1);
          auVar37 = vpmulld_avx512f(auVar38,ZEXT3264(auVar36));
          auVar21 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
          auVar19 = vpshufd_avx(auVar21,0xee);
          auVar21 = vpmulld_avx(auVar21,auVar19);
          auVar19 = vpshufd_avx(auVar21,0x55);
          auVar21 = vpmulld_avx(auVar21,auVar19);
          iVar45 = auVar21._0_4_;
        }
        uVar25 = 1;
        if (1 < uVar8) {
          uVar25 = (dEdxi->d).d[1];
        }
        if ((uVar7 != uVar4) || (uVar25 != uVar28)) goto LAB_0017faab;
        uVar28 = (int)(uVar32 % (ulong)uVar6) * iVar45;
        uVar27 = (ulong)uVar25 * (ulong)uVar7;
        if (uVar27 != 0) {
          fVar2 = pfVar17[uVar32];
          lVar31 = 0;
          uVar33 = uVar27;
          do {
            auVar39._0_4_ =
                 expf(pfVar15[(ulong)(uint)((int)(uVar32 % (ulong)uVar5) * iVar44) + lVar31] - fVar2
                     );
            auVar39._4_60_ = extraout_var_00;
            auVar21 = vfmadd213ss_fma(auVar39._0_16_,ZEXT416((uint)fVar1),
                                      ZEXT416((uint)pfVar16[(ulong)uVar28 + lVar31]));
            pfVar16[(ulong)uVar28 + lVar31] = auVar21._0_4_;
            lVar31 = lVar31 + 1;
            uVar33 = uVar33 - 1;
          } while (uVar33 != 0);
        }
        if (uVar27 < uVar26 || uVar27 - uVar26 == 0) goto LAB_0017facd;
        pfVar16[uVar28 + uVar26] = pfVar16[uVar28 + uVar26] - fVar1;
        uVar32 = (ulong)((int)uVar32 + 1);
        auVar37 = vmovdqu64_avx512f(local_98);
        auVar38 = vmovdqu64_avx512f(local_d8);
        auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      } while (uVar32 < uVar30);
    }
  }
  else {
    uVar29 = (ulong)*this->pval;
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_50,*ppTVar9);
    fVar2 = *this->logz;
    Tensor::operator*(&local_f8,dEdxi);
    pfVar24 = local_f8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    if ((local_f8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) ||
       (local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value !=
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
LAB_0017faab:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseUnaryOp<cnn::FNegLogSoftmaxBackward, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                   );
    }
    lVar31 = local_f8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_f8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    if (0 < lVar31) {
      lVar34 = 0;
      do {
        auVar40._0_4_ =
             expf(local_50.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data[lVar34] - fVar2);
        auVar40._4_60_ = extraout_var;
        auVar21 = vfmadd213ss_fma(auVar40._0_16_,ZEXT416((uint)fVar1),ZEXT416((uint)pfVar24[lVar34])
                                 );
        pfVar24[lVar34] = auVar21._0_4_;
        lVar34 = lVar34 + 1;
      } while (lVar31 - lVar34 != 0);
    }
    Tensor::operator*(&local_f8,dEdxi);
    if (local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar29 == 0 ||
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar29) {
LAB_0017facd:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    local_f8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[uVar29] =
         local_f8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data[uVar29] - fVar1;
  }
  return;
}

Assistant:

void PickNegLogSoftmax::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    if(pval) {
      const auto elem = *pval;
      gpu::pnlsoftmax_backward(dEdxi.d.size(), elem, xs[0]->v, dEdf.v, logz, dEdxi.v);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      // TODO: Again, it would be nice to do this with a single kernel
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        gpu::pnlsoftmax_backward(dEdxi.d.batch_size(), elem, xs[0]->batch_ptr(b), dEdf.v+b, logz+b, dEdxi.batch_ptr(b));
      }
    }
#else
    if(pval) {
      const auto elem = *pval;
      const float err = dEdf.v[0];
      auto x = **xs[0];
      // logz is computed in the forward pass and cached
      *dEdxi += x.unaryExpr(FNegLogSoftmaxBackward(*logz, err));
      //*dEdxi += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(*logz, err));
      (*dEdxi)(elem) -= err;
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        const float err = dEdf.v[b];
        auto x = xs[0]->batch_matrix(b);
        auto dEdxi_mat = dEdxi.batch_matrix(b);
        dEdxi_mat += x.unaryExpr(FNegLogSoftmaxBackward(logz[b], err));
        //dEdxi_mat += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(logz[b], err));
        dEdxi_mat(elem) -= err;
      }
    }
#endif
  } else {
    throw std::runtime_error("PickNegLogSoftmax::backward not yet implemented for multiple columns");
  }
}